

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_setRange_success_indexAndRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_13;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_8;
  char *_ck_x_12;
  void *_ck_x_11;
  void *_ck_x_10;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_9;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_6;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_3;
  char *_ck_x_5;
  void *_ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  code *pcStack_68;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  int _i_local;
  
  array.buffer._4_4_ = _i;
  memcpy(&stack0xffffffffffffff98,&PTR_private_ACUtilsTest_ADynArray_realloc_001a81e0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x3;
  array.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  array.size = 0x10;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*pcStack_68)(0,0x10);
  *(undefined2 *)array.capacity = 0x3130;
  *(undefined1 *)(array.capacity + 2) = 0x32;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = true;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  _ck_x._7_1_ = 0x33;
  bVar1 = private_ACUtils_ADynArray_setRange
                    (&stack0xffffffffffffff98,3,2,(void *)((long)&_ck_x + 7),1);
  if ((ulong)bVar1 != 1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x724,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_setRange(&array, 3, 2, &(c), sizeof(*(&array)->buffer)) == true"
                      ,
                      "private_ACUtils_ADynArray_setRange(&array, 3, 2, &(c), sizeof(*(&array)->buffer))"
                      ,(ulong)bVar1,"true",1,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x724);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x5) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x725,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.size == 5","array.size"
                      ,array.growStrategy,"5",5,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x725);
  if (array.size != 0x10) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x726,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.capacity == 16",
                      "array.capacity",array.size,"16",0x10,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x726);
  if (array.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x727,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                      "(void*) array.buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x727);
  if (array.deallocator == (ACUtilsDeallocator)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x728,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array.growStrategy != NULL",
                      "(void*) array.growStrategy",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x728);
  _ck_y_s = (char *)array.capacity;
  array.growStrategy[array.capacity] = (_func_size_t_size_t_size_t)0x0;
  if (array.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("01233",(char *)array.capacity);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x72a);
      if (private_ACUtilsTest_ADynArray_reallocCount != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x72b,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_ADynArray_reallocCount == 0",
                          "private_ACUtilsTest_ADynArray_reallocCount",
                          private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x72b);
      _ck_x._7_1_ = 0x36;
      bVar1 = private_ACUtils_ADynArray_setRange
                        (&stack0xffffffffffffff98,0x926,3,(void *)((long)&_ck_x + 7),1);
      if ((ulong)bVar1 != 1) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x72d,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtils_ADynArray_setRange(&array, 2342, 3, &(c), sizeof(*(&array)->buffer)) == true"
                          ,
                          "private_ACUtils_ADynArray_setRange(&array, 2342, 3, &(c), sizeof(*(&array)->buffer))"
                          ,(ulong)bVar1,"true",1,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x72d);
      if (array.growStrategy != (ACUtilsGrowStrategy)0x8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x72e,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.size == 8",
                          "array.size",array.growStrategy,"8",8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x72e);
      if (array.size == 0x10) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x72f);
        if (array.capacity == 0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x730,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                            "(void*) array.buffer",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x730);
        if (array.deallocator != (ACUtilsDeallocator)0x0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x731);
          _ck_y_s_1 = (char *)array.capacity;
          array.growStrategy[array.capacity] = (_func_size_t_size_t_size_t)0x0;
          if (array.capacity == 0) {
            _ck_y_q_1 = "";
            _ck_y_s_1 = "(null)";
          }
          else {
            _ck_y_q_1 = "\"";
            iVar2 = strcmp("01233666",(char *)array.capacity);
            if (iVar2 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x733);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                sVar3 = 0x734;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x734);
                (*array.reallocator)((void *)array.capacity,sVar3);
                return;
              }
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,0x734,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "private_ACUtilsTest_ADynArray_reallocCount == 0",
                                "private_ACUtilsTest_ADynArray_reallocCount",
                                private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
            }
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x733,
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                            "array.buffer == \"01233666\"","array.buffer",_ck_y_q_1,_ck_y_s_1,
                            _ck_y_q_1,"\"01233666\"","\"","01233666","\"",0);
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x731,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) array.growStrategy != NULL",
                          "(void*) array.growStrategy",0,0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x72f,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.capacity == 16",
                        "array.capacity",array.size,"16",0x10,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x72a,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "array.buffer == \"01233\"","array.buffer",_ck_y_q,_ck_y_s,_ck_y_q,"\"01233\"",
                    "\"","01233","\"",0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_setRange_success_indexAndRangeBeyondSize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 16;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "012", 3);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 3, 2, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01233");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    c = '6';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2342, 3, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01233666");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}